

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::TimestampTZConversion
               (Vector *vector,ArrowArray *array,ArrowScanLocalState *scan_state,
               int64_t nested_offset,int64_t parent_offset,idx_t size,int64_t conversion)

{
  void *pvVar1;
  unsigned_long *puVar2;
  bool bVar3;
  ConversionException *this;
  ulong uVar4;
  int64_t *result;
  long lVar5;
  string local_50;
  
  result = (int64_t *)vector->data;
  FlatVector::VerifyFlatVector(vector);
  lVar5 = parent_offset + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar5 = array->offset + nested_offset;
  }
  if (size != 0) {
    pvVar1 = array->buffers[1];
    uVar4 = 0;
    do {
      puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) {
        bVar3 = TryMultiplyOperator::Operation<long,long,long>
                          (*(int64_t *)((long)pvVar1 + uVar4 * 8 + lVar5 * 8),conversion,result);
        if (!bVar3) {
          this = (ConversionException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Could not convert TimestampTZ to Microsecond","");
          ConversionException::ConversionException(this,&local_50);
          __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar4 = uVar4 + 1;
      result = result + 1;
    } while (size != uVar4);
  }
  return;
}

Assistant:

static void TimestampTZConversion(Vector &vector, ArrowArray &array, const ArrowScanLocalState &scan_state,
                                  int64_t nested_offset, int64_t parent_offset, idx_t size, int64_t conversion) {
	auto tgt_ptr = FlatVector::GetData<timestamp_t>(vector);
	auto &validity_mask = FlatVector::Validity(vector);
	auto src_ptr =
	    ArrowBufferData<int64_t>(array, 1) + GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	for (idx_t row = 0; row < size; row++) {
		if (!validity_mask.RowIsValid(row)) {
			continue;
		}
		if (!TryMultiplyOperator::Operation(src_ptr[row], conversion, tgt_ptr[row].value)) {
			throw ConversionException("Could not convert TimestampTZ to Microsecond");
		}
	}
}